

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_FillColumnP(void)

{
  BYTE BVar1;
  int iVar2;
  BYTE *pBVar3;
  long lVar4;
  
  BVar1 = (BYTE)dc_color;
  if (0 < dc_count) {
    lVar4 = (long)dc_pitch;
    pBVar3 = dc_dest;
    iVar2 = dc_count;
    do {
      *pBVar3 = BVar1;
      pBVar3 = pBVar3 + lVar4;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void R_FillColumnP (void)
{
	int 				count;
	BYTE*				dest;

	count = dc_count;

	if (count <= 0)
		return;

	dest = dc_dest;

	{
		int pitch = dc_pitch;
		BYTE color = dc_color;

		do
		{
			*dest = color;
			dest += pitch;
		} while (--count);
	}
}